

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

inform_pid_lattice *
inform_pid(int *stimulus,int *responses,size_t l,size_t n,int bs,int *br,inform_error *err)

{
  uint64_t uVar1;
  inform_pid_lattice *capacity;
  inform_pid_source *piVar2;
  inform_pid_source *piVar3;
  _Bool _Var4;
  int iVar5;
  EVP_PKEY_CTX *ctx;
  inform_dist *s_dist_00;
  gvector pvVar6;
  double *pdVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  ulong local_e0;
  size_t k_1;
  double x_1;
  inform_pid_source *beta;
  size_t j;
  double u;
  size_t s_1;
  inform_pid_source *alpha_1;
  size_t i_3;
  size_t k;
  double x;
  size_t s;
  inform_pid_source *alpha;
  size_t i_2;
  inform_pid_lattice *lattice;
  size_t i_1;
  size_t i;
  double **si;
  inform_dist *s_dist;
  size_t m;
  size_t **ss;
  int *br_local;
  int bs_local;
  size_t n_local;
  size_t l_local;
  int *responses_local;
  int *stimulus_local;
  
  _Var4 = check_arguments(stimulus,responses,l,n,bs,br,err);
  if (_Var4) {
    stimulus_local = (int *)0x0;
  }
  else {
    ctx = (EVP_PKEY_CTX *)subsets(l,err);
    if ((err == (inform_error *)0x0) || (*err == INFORM_SUCCESS)) {
      capacity = *(inform_pid_lattice **)(ctx + -8);
      s_dist_00 = inform_dist_infer(stimulus,n);
      if (s_dist_00 == (inform_dist *)0x0) {
        cleanup(ctx);
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        stimulus_local = (int *)0x0;
      }
      else {
        pvVar6 = gvector_alloc((size_t)capacity,(size_t)capacity,8);
        if (pvVar6 == (gvector)0x0) {
          cleanup(ctx);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          stimulus_local = (int *)0x0;
        }
        else {
          for (i_1 = 0; i_1 < capacity; i_1 = i_1 + 1) {
            *(undefined8 *)((long)pvVar6 + i_1 * 8) = 0;
          }
          for (lattice = (inform_pid_lattice *)0x0; lattice < capacity;
              lattice = (inform_pid_lattice *)((long)&lattice->sources + 1)) {
            pdVar7 = specific_info(stimulus,responses,l,n,bs,br,
                                   *(size_t **)(ctx + (long)lattice * 8),s_dist_00,err);
            *(double **)((long)pvVar6 + (long)lattice * 8) = pdVar7;
            if ((err != (inform_error *)0x0) && (*err != INFORM_SUCCESS)) {
              cleanup(ctx);
              return (inform_pid_lattice *)0x0;
            }
          }
          stimulus_local = (int *)hasse(l,err);
          if ((err == (inform_error *)0x0) || (*err == INFORM_SUCCESS)) {
            for (alpha = (inform_pid_source *)0x0;
                alpha < (inform_pid_source *)((inform_pid_lattice *)stimulus_local)->size;
                alpha = (inform_pid_source *)((long)&alpha->name + 1)) {
              piVar2 = ((inform_pid_lattice *)stimulus_local)->sources[(long)alpha];
              piVar2->imin = 0.0;
              for (x = 0.0; (ulong)x < (ulong)(long)bs; x = (double)((long)x + 1)) {
                k = *(size_t *)(*(long *)((long)pvVar6 + (*piVar2->name - 1) * 8) + (long)x * 8);
                for (i_3 = 1; i_3 < piVar2->size; i_3 = i_3 + 1) {
                  if (*(double *)
                       (*(long *)((long)pvVar6 + (piVar2->name[i_3] - 1) * 8) + (long)x * 8) <=
                      (double)k) {
                    local_e8 = *(size_t *)
                                (*(long *)((long)pvVar6 + (piVar2->name[i_3] - 1) * 8) + (long)x * 8
                                );
                  }
                  else {
                    local_e8 = k;
                  }
                  k = local_e8;
                }
                piVar2->imin = (double)s_dist_00->histogram[(long)x] * (double)k + piVar2->imin;
              }
              uVar1 = s_dist_00->counts;
              auVar9._8_4_ = (int)(uVar1 >> 0x20);
              auVar9._0_8_ = uVar1;
              auVar9._12_4_ = 0x45300000;
              piVar2->imin = piVar2->imin /
                             ((auVar9._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
            }
            for (alpha_1 = (inform_pid_source *)0x0;
                alpha_1 < (inform_pid_source *)((inform_pid_lattice *)stimulus_local)->size;
                alpha_1 = (inform_pid_source *)((long)&alpha_1->name + 1)) {
              piVar2 = ((inform_pid_lattice *)stimulus_local)->sources[(long)alpha_1];
              for (u = 0.0; (ulong)u < (ulong)(long)bs; u = (double)((long)u + 1)) {
                j = 0xfff0000000000000;
                for (beta = (inform_pid_source *)0x0; beta < (inform_pid_source *)piVar2->n_below;
                    beta = (inform_pid_source *)((long)&beta->name + 1)) {
                  piVar3 = piVar2->below[(long)beta];
                  k_1 = *(size_t *)(*(long *)((long)pvVar6 + (*piVar3->name - 1) * 8) + (long)u * 8)
                  ;
                  for (local_e0 = 1; local_e0 < piVar3->size; local_e0 = local_e0 + 1) {
                    if (*(double *)
                         (*(long *)((long)pvVar6 + (piVar3->name[local_e0] - 1) * 8) + (long)u * 8)
                        <= (double)k_1) {
                      local_f0 = *(size_t *)
                                  (*(long *)((long)pvVar6 + (piVar3->name[local_e0] - 1) * 8) +
                                  (long)u * 8);
                    }
                    else {
                      local_f0 = k_1;
                    }
                    k_1 = local_f0;
                  }
                  if ((double)j <= (double)k_1) {
                    local_f8 = k_1;
                  }
                  else {
                    local_f8 = j;
                  }
                  j = local_f8;
                }
                iVar8 = 1;
                if ((long)j < 0) {
                  iVar8 = -1;
                }
                iVar5 = 0;
                if (ABS((double)j) == INFINITY) {
                  iVar5 = iVar8;
                }
                if (iVar5 != 0) {
                  j = 0;
                }
                piVar2->pi = (double)s_dist_00->histogram[(long)u] * (double)j + piVar2->pi;
              }
              uVar1 = s_dist_00->counts;
              auVar10._8_4_ = (int)(uVar1 >> 0x20);
              auVar10._0_8_ = uVar1;
              auVar10._12_4_ = 0x45300000;
              piVar2->pi = piVar2->imin -
                           piVar2->pi /
                           ((auVar10._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
            }
            cleanup(ctx);
          }
          else {
            cleanup(ctx);
            stimulus_local = (int *)0x0;
          }
        }
      }
    }
    else {
      stimulus_local = (int *)0x0;
    }
  }
  return (inform_pid_lattice *)stimulus_local;
}

Assistant:

inform_pid_lattice *inform_pid(int const *stimulus, int const *responses,
        size_t l, size_t n, int bs, int const *br, inform_error *err)
{
    if (check_arguments(stimulus, responses, l, n, bs, br, err))
    {
        return NULL;
    }
    size_t **ss = subsets(l, err);
    if (FAILED(err))
    {
        return NULL;
    }

    size_t const m = gvector_len(ss);

    inform_dist *s_dist = inform_dist_infer(stimulus, n);
    if (s_dist == NULL)
    {
        cleanup(ss, NULL, NULL);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    double **si = gvector_alloc(m, m, sizeof(double*));
    if (si == NULL)
    {
        cleanup(ss, s_dist, si);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 0; i < m; ++i) si[i] = NULL;
    for (size_t i = 0; i < m; ++i)
    {
        si[i] = specific_info(stimulus, responses, l, n, bs, br, ss[i], s_dist, err);
        if (FAILED(err))
        {
            cleanup(ss, s_dist, si);
            return NULL;
        }
    }

    inform_pid_lattice *lattice = hasse(l, err);
    if (FAILED(err))
    {
        cleanup(ss, s_dist, si);
        return NULL;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        alpha->imin = 0.0;
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double x = si[alpha->name[0]-1][s];
            for (size_t k = 1; k < alpha->size; ++k)
            {
                x = MIN(x, si[alpha->name[k]-1][s]);
            }
            alpha->imin += s_dist->histogram[s] * x;
        }
        alpha->imin /= s_dist->counts;
    }

    for (size_t i = 0; i < lattice->size; ++i)
    {
        inform_pid_source *alpha = lattice->sources[i];
        for (size_t s = 0; s < (size_t)bs; ++s)
        {
            double u = -INFINITY;
            for (size_t j = 0; j < alpha->n_below; ++j)
            {
                inform_pid_source *beta = alpha->below[j];
                double x = si[beta->name[0]-1][s];
                for (size_t k = 1; k < beta->size; ++k)
                {
                    x = MIN(x, si[beta->name[k]-1][s]);
                }
                u = MAX(u, x);
            }
            if (isinf(u))
            {
                u = 0.0;
            }
            alpha->pi += s_dist->histogram[s] * u;
        }
        alpha->pi = alpha->imin - alpha->pi / s_dist->counts;
    }

    cleanup(ss, s_dist, si);

    return lattice;
}